

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

Expression * __thiscall soul::heart::Parser::parseExpression(Parser *this,FunctionParseState *state)

{
  bool bVar1;
  Variable *lhs;
  TypeCast *lhs_00;
  Expression *pEVar2;
  Allocator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  Type local_1f0;
  Type local_1d8;
  char *local_1c0;
  Type local_1b8;
  char *local_1a0;
  Type local_198;
  char *local_180;
  Type local_178;
  char *local_160;
  Type local_158;
  char *local_140;
  Value local_138;
  undefined1 local_f8 [8];
  Value infOrNaN;
  CompileMessage local_b0;
  uint local_74;
  undefined1 local_70 [8];
  pool_ptr<soul::heart::Variable> v;
  undefined1 local_58 [8];
  string name;
  CodeLocation errorPos;
  FunctionParseState *state_local;
  Parser *this_local;
  
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"add");
  if (bVar1) {
    this_local = (Parser *)parseBinaryOp(this,state,add);
  }
  else {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"subtract");
    if (bVar1) {
      this_local = (Parser *)parseBinaryOp(this,state,subtract);
    }
    else {
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
              ::matchIf<char_const*>
                        ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                          *)this,"multiply");
      if (bVar1) {
        this_local = (Parser *)parseBinaryOp(this,state,multiply);
      }
      else {
        bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                ::matchIf<char_const*>
                          ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                            *)this,"divide");
        if (bVar1) {
          this_local = (Parser *)parseBinaryOp(this,state,divide);
        }
        else {
          bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                  ::matchIf<char_const*>
                            ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                              *)this,"modulo");
          if (bVar1) {
            this_local = (Parser *)parseBinaryOp(this,state,modulo);
          }
          else {
            bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                    ::matchIf<char_const*>
                              ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                *)this,"bitwiseOr");
            if (bVar1) {
              this_local = (Parser *)parseBinaryOp(this,state,bitwiseOr);
            }
            else {
              bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      ::matchIf<char_const*>
                                ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                  *)this,"bitwiseAnd");
              if (bVar1) {
                this_local = (Parser *)parseBinaryOp(this,state,bitwiseAnd);
              }
              else {
                bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        ::matchIf<char_const*>
                                  ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                    *)this,"bitwiseXor");
                if (bVar1) {
                  this_local = (Parser *)parseBinaryOp(this,state,bitwiseXor);
                }
                else {
                  bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                          ::matchIf<char_const*>
                                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                      *)this,"logicalOr");
                  if (bVar1) {
                    this_local = (Parser *)parseBinaryOp(this,state,logicalOr);
                  }
                  else {
                    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                            ::matchIf<char_const*>
                                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                        *)this,"logicalAnd");
                    if (bVar1) {
                      this_local = (Parser *)parseBinaryOp(this,state,logicalAnd);
                    }
                    else {
                      bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                              ::matchIf<char_const*>
                                        ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                          *)this,"equals");
                      if (bVar1) {
                        this_local = (Parser *)parseBinaryOp(this,state,equals);
                      }
                      else {
                        bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                ::matchIf<char_const*>
                                          ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                            *)this,"notEquals");
                        if (bVar1) {
                          this_local = (Parser *)parseBinaryOp(this,state,notEquals);
                        }
                        else {
                          bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                  ::matchIf<char_const*>
                                            ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                              *)this,"lessThan");
                          if (bVar1) {
                            this_local = (Parser *)parseBinaryOp(this,state,lessThan);
                          }
                          else {
                            bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                    ::matchIf<char_const*>
                                              ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                                *)this,"lessThanOrEqual");
                            if (bVar1) {
                              this_local = (Parser *)parseBinaryOp(this,state,lessThanOrEqual);
                            }
                            else {
                              bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                      ::matchIf<char_const*>
                                                ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                                  *)this,"greaterThan");
                              if (bVar1) {
                                this_local = (Parser *)parseBinaryOp(this,state,greaterThan);
                              }
                              else {
                                bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                        ::matchIf<char_const*>
                                                  ((
                                                  Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                                  *)this,"greaterThanOrEqual");
                                if (bVar1) {
                                  this_local = (Parser *)
                                               parseBinaryOp(this,state,greaterThanOrEqual);
                                }
                                else {
                                  bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                          ::matchIf<char_const*>
                                                    ((
                                                  Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                                  *)this,"leftShift");
                                  if (bVar1) {
                                    this_local = (Parser *)parseBinaryOp(this,state,leftShift);
                                  }
                                  else {
                                    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                            ::matchIf<char_const*>
                                                      ((
                                                  Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                                  *)this,"rightShift");
                                    if (bVar1) {
                                      this_local = (Parser *)parseBinaryOp(this,state,rightShift);
                                    }
                                    else {
                                      bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                              ::matchIf<char_const*>
                                                        ((
                                                  Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                                  *)this,"rightShiftUnsigned");
                                      if (bVar1) {
                                        this_local = (Parser *)
                                                     parseBinaryOp(this,state,rightShiftUnsigned);
                                      }
                                      else {
                                        bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                                ::matchIf<char_const*>
                                                          ((
                                                  Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                                  *)this,"negate");
                                        if (bVar1) {
                                          this_local = (Parser *)parseUnaryOp(this,state,negate);
                                        }
                                        else {
                                          bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                                  ::matchIf<char_const*>
                                                            ((
                                                  Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                                  *)this,"logicalNot");
                                          if (bVar1) {
                                            this_local = (Parser *)
                                                         parseUnaryOp(this,state,logicalNot);
                                          }
                                          else {
                                            bVar1 = 
                                                  Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                                  ::matchIf<char_const*>
                                                            ((
                                                  Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                                  *)this,"bitwiseNot");
                                            if (bVar1) {
                                              this_local = (Parser *)
                                                           parseUnaryOp(this,state,bitwiseNot);
                                            }
                                            else {
                                              bVar1 = 
                                                  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ::matches(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ,(TokenType)"$variableIdentifier");
                                              if (bVar1) {
                                                CodeLocation::CodeLocation
                                                          ((CodeLocation *)((long)&name.field_2 + 8)
                                                           ,&(this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ).location);
                                                readQualifiedVariableIdentifier_abi_cxx11_
                                                          ((string *)local_58,this);
                                                findVariable((Parser *)local_70,
                                                             (FunctionParseState *)this,
                                                             (string *)state);
                                                bVar1 = soul::pool_ptr::operator_cast_to_bool
                                                                  ((pool_ptr *)local_70);
                                                if (bVar1) {
                                                  lhs = pool_ptr<soul::heart::Variable>::operator*
                                                                  ((pool_ptr<soul::heart::Variable>
                                                                    *)local_70);
                                                  this_local = (Parser *)
                                                               parseSuffixOperators
                                                                         (this,state,
                                                                          &lhs->super_Expression);
                                                }
                                                local_74 = (uint)bVar1;
                                                pool_ptr<soul::heart::Variable>::~pool_ptr
                                                          ((pool_ptr<soul::heart::Variable> *)
                                                           local_70);
                                                if (local_74 == 0) {
                                                  Errors::unresolvedSymbol<std::__cxx11::string&>
                                                            (&local_b0,(Errors *)local_58,args);
                                                  CodeLocation::throwError
                                                            ((CodeLocation *)
                                                             ((long)&name.field_2 + 8),&local_b0);
                                                }
                                                std::__cxx11::string::~string((string *)local_58);
                                                CodeLocation::~CodeLocation
                                                          ((CodeLocation *)((long)&name.field_2 + 8)
                                                          );
                                              }
                                              else {
                                                infOrNaN.allocatedData.allocatedData.space[0] =
                                                     (uint64_t)anon_var_dwarf_10ecd1;
                                                bVar1 = 
                                                  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ::matches(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ,(TokenType)"$identifier");
                                                if (bVar1) {
                                                  bVar1 = 
                                                  Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                                  ::matchIf<char_const*>
                                                            ((
                                                  Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                                  *)this,"cast");
                                                  if (bVar1) {
                                                    lhs_00 = parseCast(this,state);
                                                    pEVar2 = parseSuffixOperators
                                                                       (this,state,
                                                                        &lhs_00->super_Expression);
                                                    return pEVar2;
                                                  }
                                                  parseNaNandInfinityTokens((Value *)local_f8,this);
                                                  bVar1 = soul::Value::isValid((Value *)local_f8);
                                                  if (bVar1) {
                                                    this_00 = Program::getAllocator(&this->program);
                                                    soul::Value::Value(&local_138,(Value *)local_f8)
                                                    ;
                                                    this_local = (Parser *)
                                                                 Allocator::allocateConstant
                                                                           (this_00,&local_138);
                                                    soul::Value::~Value(&local_138);
                                                    local_74 = 1;
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                                  ::matchIf<char_const*>
                                                            ((
                                                  Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                                  *)this,"processor");
                                                  if (bVar1) {
                                                    this_local = (Parser *)
                                                                 parseProcessorProperty(this);
                                                    local_74 = 1;
                                                  }
                                                  else {
                                                    local_74 = 0;
                                                  }
                                                  }
                                                  soul::Value::~Value((Value *)local_f8);
                                                  if (local_74 != 0) {
                                                    return (Expression *)this_local;
                                                  }
                                                }
                                                local_140 = "$integer32";
                                                bVar1 = 
                                                  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ::matches(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ,(TokenType)"$integer32");
                                                if (bVar1) {
                                                  Type::Type(&local_158,int32);
                                                  this_local = (Parser *)
                                                               parseConstantAsExpression
                                                                         (this,state,&local_158);
                                                  Type::~Type(&local_158);
                                                }
                                                else {
                                                  local_160 = "$integer64";
                                                  bVar1 = 
                                                  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ::matches(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ,(TokenType)"$integer64");
                                                  if (bVar1) {
                                                    Type::Type(&local_178,int64);
                                                    this_local = (Parser *)
                                                                 parseConstantAsExpression
                                                                           (this,state,&local_178);
                                                    Type::~Type(&local_178);
                                                  }
                                                  else {
                                                    local_180 = "$float32";
                                                    bVar1 = 
                                                  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ::matches(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ,(TokenType)"$float32");
                                                  if (bVar1) {
                                                    Type::Type(&local_198,float32);
                                                    this_local = (Parser *)
                                                                 parseConstantAsExpression
                                                                           (this,state,&local_198);
                                                    Type::~Type(&local_198);
                                                  }
                                                  else {
                                                    local_1a0 = "$float64";
                                                    bVar1 = 
                                                  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ::matches(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ,(TokenType)"$float64");
                                                  if (bVar1) {
                                                    Type::Type(&local_1b8,float64);
                                                    this_local = (Parser *)
                                                                 parseConstantAsExpression
                                                                           (this,state,&local_1b8);
                                                    Type::~Type(&local_1b8);
                                                  }
                                                  else {
                                                    local_1c0 = "$string literal";
                                                    bVar1 = 
                                                  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ::matches(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ,(TokenType)"$string literal");
                                                  if (bVar1) {
                                                    Type::createStringLiteral();
                                                    this_local = (Parser *)
                                                                 parseConstantAsExpression
                                                                           (this,state,&local_1d8);
                                                    Type::~Type(&local_1d8);
                                                  }
                                                  else {
                                                    readValueType(&local_1f0,this);
                                                    this_local = (Parser *)
                                                                 parseConstantAsExpression
                                                                           (this,state,&local_1f0);
                                                    Type::~Type(&local_1f0);
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (Expression *)this_local;
}

Assistant:

heart::Expression& parseExpression (const FunctionParseState& state)
    {
        #define SOUL_MATCH_BINARY_OP_NAME(name, op) \
            if (matchIf (#name)) return parseBinaryOp (state, BinaryOp::Op::name);
        SOUL_BINARY_OPS (SOUL_MATCH_BINARY_OP_NAME)
        #undef SOUL_MATCH_BINARY_OP_NAME

        #define SOUL_COMPARE_UNARY_OP(name, op) \
            if (matchIf (#name)) return parseUnaryOp (state, UnaryOp::Op::name);
        SOUL_UNARY_OPS (SOUL_COMPARE_UNARY_OP)
        #undef SOUL_COMPARE_UNARY_OP

        if (matches (Token::variableIdentifier))
        {
            auto errorPos = location;
            auto name = readQualifiedVariableIdentifier();

            if (auto v = findVariable (state, name))
                return parseSuffixOperators (state, *v);

            errorPos.throwError (Errors::unresolvedSymbol (name));
        }

        if (matches (Token::identifier))
        {
            if (matchIf ("cast"))
                return parseSuffixOperators (state, parseCast (state));

            auto infOrNaN = parseNaNandInfinityTokens();

            if (infOrNaN.isValid())
                return program.getAllocator().allocateConstant (infOrNaN);

            if (matchIf ("processor"))
                return parseProcessorProperty();
        }

        if (matches (Token::literalInt32))       return parseConstantAsExpression (state, PrimitiveType::int32);
        if (matches (Token::literalInt64))       return parseConstantAsExpression (state, PrimitiveType::int64);
        if (matches (Token::literalFloat32))     return parseConstantAsExpression (state, PrimitiveType::float32);
        if (matches (Token::literalFloat64))     return parseConstantAsExpression (state, PrimitiveType::float64);
        if (matches (Token::literalString))      return parseConstantAsExpression (state, Type::createStringLiteral());

        return parseConstantAsExpression (state, readValueType());
    }